

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O1

void __thiscall Float_Exponential_Test::~Float_Exponential_Test(Float_Exponential_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Float, Exponential) {
    test_parsing("2e3", 2000);
    test_parsing("2e-3", 0.002);
    test_parsing("2e0", 2);
    test_parsing("2e+0", 2);
    test_parsing("2e-0", 2);
    test_parsing("+2e-1", 0.2);
    test_parsing("-2e-1", -0.2);
    test_parsing("1e+123", 1e123);
    test_parsing("1e-123", 1e-123);

    test_parsing("2E3", 2000);
    test_parsing("2E-3", 0.002);
    test_parsing("2E0", 2);
    test_parsing("2E+0", 2);
    test_parsing("2E-0", 2);
    test_parsing("+2E-1", 0.2);
    test_parsing("-2E-1", -0.2);
    test_parsing("1E+123", 1e123);
    test_parsing("1E-123", 1e-123);
}